

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordermatch.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  undefined **ppuVar2;
  undefined **ppuVar3;
  undefined **ppuVar4;
  int iVar5;
  const_iterator cVar6;
  size_t sVar7;
  string value;
  string file;
  SessionSettings settings;
  Application application;
  FileStoreFactory storeFactory;
  ScreenLogFactory logFactory;
  SocketAcceptor acceptor;
  undefined1 *local_5b0;
  long local_5a8;
  undefined1 local_5a0;
  undefined7 uStack_59f;
  key_type local_590;
  undefined **local_570;
  undefined **local_568;
  undefined **local_560;
  undefined **local_558;
  _func_int **local_550;
  undefined **local_548;
  undefined **local_540;
  undefined **local_538;
  undefined **local_530;
  long *local_528 [2];
  long local_518 [2];
  SessionSettings local_508;
  undefined1 local_478 [104];
  _Alloc_hider local_410;
  char local_400 [16];
  bool local_3f0;
  Application local_3e8;
  undefined **local_3e0;
  undefined **local_3d8;
  undefined **local_3d0;
  undefined **local_3c8;
  undefined **local_3c0;
  undefined **local_3b8;
  undefined **local_3b0;
  undefined **local_3a8;
  undefined **local_3a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
  local_398;
  undefined8 uStack_368;
  undefined8 local_360;
  code *local_358;
  long *local_350;
  long local_340 [2];
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  local_330;
  Dictionary local_300;
  undefined *local_2a0 [2];
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  local_290;
  Dictionary local_260;
  allocator<char> local_200 [464];
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_528,argv[1],local_200);
    FIX::SessionSettings::SessionSettings(&local_508,(string *)local_528,false);
    local_398._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_398._M_impl.super__Rb_tree_header._M_header;
    local_3e8._vptr_Application = (_func_int **)&PTR__Application_00158778;
    local_3e0 = &PTR__Application_001587f0;
    local_3d8 = &PTR__Application_001589d0;
    local_3d0 = &PTR__Application_00158bc0;
    local_3c8 = &PTR__Application_00158ed0;
    local_3c0 = &PTR__Application_00159340;
    local_3b8 = &PTR__Application_00159940;
    local_530 = &PTR__Application_00159f40;
    local_3b0 = &PTR__Application_00159f40;
    local_538 = &PTR__Application_0015a600;
    local_3a8 = &PTR__Application_0015a600;
    local_540 = &PTR__Application_0015aff0;
    local_3a0 = &PTR__Application_0015aff0;
    local_398._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_398._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_398._M_impl.super__Rb_tree_header._M_node_count = 0;
    uStack_368 = 0;
    local_360 = 0;
    local_398._M_impl.super__Rb_tree_header._M_header._M_right =
         local_398._M_impl.super__Rb_tree_header._M_header._M_left;
    FIX::FileStoreFactory::FileStoreFactory((FileStoreFactory *)&local_358,&local_508);
    local_548 = &PTR__Application_00159940;
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)local_478,
               (_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)&local_508);
    local_478._48_8_ = &PTR__Dictionary_00160d38;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_478 + 0x38),&local_508.m_defaults.m_data._M_t);
    local_410._M_p = local_400;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_410,local_508.m_defaults.m_name._M_dataplus._M_p,
               local_508.m_defaults.m_name._M_dataplus._M_p +
               local_508.m_defaults.m_name._M_string_length);
    local_3f0 = local_508.m_resolveEnvVars;
    FIX::ScreenLogFactory::ScreenLogFactory
              ((ScreenLogFactory *)local_2a0,(SessionSettings *)local_478);
    FIX::Dictionary::~Dictionary((Dictionary *)(local_478 + 0x30));
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)local_478);
    FIX::SocketAcceptor::SocketAcceptor
              ((SocketAcceptor *)local_200,&local_3e8,(MessageStoreFactory *)&local_358,&local_508,
               (LogFactory *)local_2a0);
    local_570 = &PTR__Application_00159340;
    local_568 = &PTR__Application_00158ed0;
    local_560 = &PTR__Application_00158bc0;
    local_558 = &PTR__Application_001589d0;
    local_550 = (_func_int **)&PTR__Application_00158778;
    FIX::Acceptor::start();
    do {
      local_5a8 = 0;
      local_5a0 = 0;
      local_5b0 = &local_5a0;
      std::operator>>((istream *)&std::cin,(string *)&local_5b0);
      iVar5 = std::__cxx11::string::compare((char *)&local_5b0);
      if (iVar5 == 0) {
        OrderMatcher::display((OrderMatcher *)&local_398);
LAB_001413a3:
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        bVar1 = true;
        std::ostream::flush();
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_5b0);
        if (iVar5 != 0) {
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_590,local_5b0,local_5b0 + local_5a8);
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
                  ::find(&local_398,&local_590);
          if ((_Rb_tree_header *)cVar6._M_node != &local_398._M_impl.super__Rb_tree_header) {
            Market::display((Market *)(cVar6._M_node + 2));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001413a3;
        }
        bVar1 = false;
      }
      if (local_5b0 != &local_5a0) {
        operator_delete(local_5b0,CONCAT71(uStack_59f,local_5a0) + 1);
      }
    } while (bVar1);
    FIX::Acceptor::stop(false);
    FIX::SocketAcceptor::~SocketAcceptor((SocketAcceptor *)local_200);
    local_2a0[0] = &FIX::Message::typeinfo;
    FIX::Dictionary::~Dictionary(&local_260);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree(&local_290);
    local_358 = __cxa_finalize;
    FIX::Dictionary::~Dictionary(&local_300);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree(&local_330);
    ppuVar4 = local_560;
    ppuVar3 = local_568;
    ppuVar2 = local_570;
    if (local_350 != local_340) {
      operator_delete(local_350,local_340[0] + 1);
    }
    local_3e8._vptr_Application = local_550;
    local_3e0 = &PTR__Application_001587f0;
    local_3d8 = local_558;
    local_3d0 = ppuVar4;
    local_3c8 = ppuVar3;
    local_3c0 = ppuVar2;
    local_3b8 = local_548;
    local_3b0 = local_530;
    local_3a8 = local_538;
    local_3a0 = local_540;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
    ::~_Rb_tree(&local_398);
    FIX::Dictionary::~Dictionary(&local_508.m_defaults);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)&local_508);
    if (local_528[0] != local_518) {
      operator_delete(local_528[0],local_518[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1621b0);
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FILE.",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);
    FIX::SocketAcceptor acceptor(application, storeFactory, settings, logFactory);

    acceptor.start();
    while (true) {
      std::string value;
      std::cin >> value;

      if (value == "#symbols") {
        application.orderMatcher().display();
      } else if (value == "#quit") {
        break;
      } else {
        application.orderMatcher().display(value);
      }

      std::cout << std::endl;
    }
    acceptor.stop();
    return 0;
  } catch (std::exception &e) {
    std::cout << e.what() << std::endl;
    return 1;
  }
}